

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall pfederc::Lexer::~Lexer(Lexer *this)

{
  Lexer *this_local;
  
  this->_vptr_Lexer = (_func_int **)&PTR__Lexer_0017f5a0;
  std::__cxx11::string::~string((string *)&this->lastComment);
  std::
  vector<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>_>_>
  ::~vector(&this->errors);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->lineIndices);
  std::
  vector<std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>,_std::allocator<std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>_>_>
  ::~vector(&this->tokens);
  std::__cxx11::string::~string((string *)&this->fileContent);
  std::__cxx11::string::~string((string *)&this->filePath);
  return;
}

Assistant:

Lexer::~Lexer() {
}